

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O0

bool __thiscall
CommandLineTestRunner::parseArguments(CommandLineTestRunner *this,TestPlugin *plugin)

{
  long *plVar1;
  bool bVar2;
  long lVar3;
  SimpleString *pSVar4;
  undefined8 uVar5;
  long *in_RDI;
  TestPlugin *in_stack_000001b0;
  CommandLineArguments *in_stack_000001b8;
  char *local_30;
  bool local_1;
  
  bVar2 = CommandLineArguments::parse(in_stack_000001b8,in_stack_000001b0);
  if (bVar2) {
    bVar2 = CommandLineArguments::isJUnitOutput((CommandLineArguments *)in_RDI[2]);
    if (bVar2) {
      pSVar4 = CommandLineArguments::getPackageName((CommandLineArguments *)in_RDI[2]);
      lVar3 = (**(code **)(*in_RDI + 0x18))(in_RDI,pSVar4);
      in_RDI[1] = lVar3;
      bVar2 = CommandLineArguments::isVerbose((CommandLineArguments *)in_RDI[2]);
      if (bVar2) {
        lVar3 = in_RDI[1];
        uVar5 = (**(code **)(*in_RDI + 0x20))();
        lVar3 = (**(code **)(*in_RDI + 0x28))(in_RDI,lVar3,uVar5);
        in_RDI[1] = lVar3;
      }
    }
    else {
      bVar2 = CommandLineArguments::isTeamCityOutput((CommandLineArguments *)in_RDI[2]);
      if (bVar2) {
        lVar3 = (**(code **)(*in_RDI + 0x10))();
        in_RDI[1] = lVar3;
      }
      else {
        lVar3 = (**(code **)(*in_RDI + 0x20))();
        in_RDI[1] = lVar3;
      }
    }
    local_1 = true;
  }
  else {
    lVar3 = (**(code **)(*in_RDI + 0x20))();
    in_RDI[1] = lVar3;
    plVar1 = (long *)in_RDI[1];
    bVar2 = CommandLineArguments::needHelp((CommandLineArguments *)in_RDI[2]);
    if (bVar2) {
      local_30 = CommandLineArguments::help((CommandLineArguments *)in_RDI[2]);
    }
    else {
      local_30 = CommandLineArguments::usage((CommandLineArguments *)in_RDI[2]);
    }
    (**(code **)(*plVar1 + 0x58))(plVar1,local_30);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CommandLineTestRunner::parseArguments(TestPlugin* plugin)
{
  if (!arguments_->parse(plugin)) {
    output_ = createConsoleOutput();
    output_->print((arguments_->needHelp()) ? arguments_->help() : arguments_->usage());
    return false;
  }

  if (arguments_->isJUnitOutput()) {
    output_= createJUnitOutput(arguments_->getPackageName());
    if (arguments_->isVerbose())
      output_ = createCompositeOutput(output_, createConsoleOutput());
  } else if (arguments_->isTeamCityOutput()) {
    output_ = createTeamCityOutput();
  } else
    output_ = createConsoleOutput();
  return true;
}